

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

int check_trailing_bits_after_symbol_coder(aom_reader *r)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  ulong uVar7;
  
  iVar1 = aom_reader_has_overflowed(r);
  iVar6 = -1;
  if (iVar1 == 0) {
    uVar2 = aom_reader_tell(r);
    uVar7 = (ulong)(uVar2 + 7 >> 3);
    puVar4 = aom_reader_find_begin(r);
    uVar3 = 0x80 >> ((byte)(uVar2 + 7) & 7);
    if ((uVar3 * 2 - 1 & (uint)puVar4[uVar7 - 1]) == uVar3) {
      puVar5 = aom_reader_find_end(r);
      for (puVar4 = puVar4 + uVar7; puVar4 < puVar5; puVar4 = puVar4 + 1) {
        if (*puVar4 != '\0') {
          return -1;
        }
      }
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int check_trailing_bits_after_symbol_coder(aom_reader *r) {
  if (aom_reader_has_overflowed(r)) return -1;

  uint32_t nb_bits = aom_reader_tell(r);
  uint32_t nb_bytes = (nb_bits + 7) >> 3;
  const uint8_t *p = aom_reader_find_begin(r) + nb_bytes;

  // aom_reader_tell() returns 1 for a newly initialized decoder, and the
  // return value only increases as values are decoded. So nb_bits > 0, and
  // thus p > p_begin. Therefore accessing p[-1] is safe.
  uint8_t last_byte = p[-1];
  uint8_t pattern = 128 >> ((nb_bits - 1) & 7);
  if ((last_byte & (2 * pattern - 1)) != pattern) return -1;

  // Make sure that all padding bytes are zero as required by the spec.
  const uint8_t *p_end = aom_reader_find_end(r);
  while (p < p_end) {
    if (*p != 0) return -1;
    p++;
  }
  return 0;
}